

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O1

void tif_11uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  int iVar11;
  byte *pbVar12;
  byte *pbVar13;
  int needed;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  
  if ((length & 0xfffffffffffffff8) == 0) {
    uVar15 = 0;
  }
  else {
    uVar15 = 0;
    do {
      bVar1 = pSrc[1];
      bVar2 = pSrc[2];
      bVar3 = pSrc[3];
      bVar4 = pSrc[4];
      bVar5 = pSrc[5];
      bVar6 = pSrc[6];
      bVar7 = pSrc[7];
      bVar8 = pSrc[8];
      bVar9 = pSrc[9];
      bVar10 = pSrc[10];
      pDst[uVar15] = (uint)(bVar1 >> 5) + (uint)*pSrc * 8;
      pDst[uVar15 + 1] = (uint)(bVar2 >> 2) | (bVar1 & 0x1f) << 6;
      pDst[uVar15 + 2] = (uint)(bVar4 >> 7) | (bVar2 & 3) * 0x200 + (uint)bVar3 * 2;
      pDst[uVar15 + 3] = (uint)(bVar5 >> 4) | (bVar4 & 0x7f) << 4;
      pDst[uVar15 + 4] = (uint)(bVar6 >> 1) | (bVar5 & 0xf) << 7;
      pDst[uVar15 + 5] = (uint)(bVar8 >> 6) | (bVar6 & 1) * 0x400 + (uint)bVar7 * 4;
      pDst[uVar15 + 6] = (uint)(bVar9 >> 3) | (bVar8 & 0x3f) << 5;
      pDst[uVar15 + 7] = (bVar9 & 7) << 8 | (uint)bVar10;
      pSrc = pSrc + 0xb;
      uVar15 = uVar15 + 8;
    } while (uVar15 < (length & 0xfffffffffffffff8));
  }
  if ((length & 7) != 0) {
    bVar1 = pSrc[1];
    pDst[uVar15] = (uint)(bVar1 >> 5) + (uint)*pSrc * 8;
    uVar18 = (uint)(length & 7);
    if (uVar18 != 1) {
      uVar16 = (uint)pSrc[2];
      pDst[uVar15 + 1] = (uint)(pSrc[2] >> 2) | (bVar1 & 0x1f) << 6;
      if (2 < uVar18) {
        iVar11 = 2;
        iVar14 = 0xb;
        uVar17 = 0;
        pbVar13 = pSrc + 3;
        do {
          pbVar12 = pbVar13;
          iVar14 = iVar14 - iVar11;
          bVar1 = (byte)iVar14 & 0x1f;
          uVar17 = (uVar17 | ~(-1 << (sbyte)iVar11) & uVar16) << bVar1;
          uVar16 = (uint)*pbVar12;
          pbVar13 = pbVar12 + 1;
          iVar11 = 8;
        } while (8 < iVar14);
        iVar11 = 8 - iVar14;
        pDst[uVar15 + 2] =
             ~(-1 << ((byte)iVar14 & 0x1f)) & (uint)(*pbVar12 >> ((byte)iVar11 & 0x1f)) | uVar17;
        if (uVar18 != 3) {
          if (iVar14 == 8) {
            uVar16 = (uint)*pbVar13;
            pbVar13 = pbVar12 + 2;
            iVar11 = 8;
          }
          if (iVar11 < 0xb) {
            iVar14 = 0xb;
            uVar17 = 0;
            do {
              iVar14 = iVar14 - iVar11;
              uVar17 = (~(-1 << ((byte)iVar11 & 0x1f)) & uVar16 | uVar17) << ((byte)iVar14 & 0x1f);
              uVar16 = (uint)*pbVar13;
              pbVar13 = pbVar13 + 1;
              iVar11 = 8;
            } while (8 < iVar14);
          }
          else {
            uVar17 = 0 << bVar1;
            iVar14 = 0xb;
          }
          iVar11 = iVar11 - iVar14;
          pDst[uVar15 + 3] =
               ~(-1 << ((byte)iVar14 & 0x1f)) & uVar16 >> ((byte)iVar11 & 0x1f) | uVar17;
          if (4 < uVar18) {
            if (iVar11 == 0) {
              uVar16 = (uint)*pbVar13;
              pbVar13 = pbVar13 + 1;
              iVar11 = 8;
            }
            if (iVar11 < 0xb) {
              iVar14 = 0xb;
              uVar17 = 0;
              do {
                iVar14 = iVar14 - iVar11;
                uVar17 = (~(-1 << ((byte)iVar11 & 0x1f)) & uVar16 | uVar17) << ((byte)iVar14 & 0x1f)
                ;
                uVar16 = (uint)*pbVar13;
                pbVar13 = pbVar13 + 1;
                iVar11 = 8;
              } while (8 < iVar14);
            }
            else {
              uVar17 = 0;
              iVar14 = 0xb;
            }
            iVar11 = iVar11 - iVar14;
            pDst[uVar15 + 4] =
                 ~(-1 << ((byte)iVar14 & 0x1f)) & uVar16 >> ((byte)iVar11 & 0x1f) | uVar17;
            if (uVar18 != 5) {
              if (iVar11 == 0) {
                uVar16 = (uint)*pbVar13;
                pbVar13 = pbVar13 + 1;
                iVar11 = 8;
              }
              if (iVar11 < 0xb) {
                iVar14 = 0xb;
                uVar17 = 0;
                do {
                  iVar14 = iVar14 - iVar11;
                  uVar17 = (~(-1 << ((byte)iVar11 & 0x1f)) & uVar16 | uVar17) <<
                           ((byte)iVar14 & 0x1f);
                  uVar16 = (uint)*pbVar13;
                  pbVar13 = pbVar13 + 1;
                  iVar11 = 8;
                } while (8 < iVar14);
              }
              else {
                uVar17 = 0;
                iVar14 = 0xb;
              }
              iVar11 = iVar11 - iVar14;
              pDst[uVar15 + 5] =
                   ~(-1 << ((byte)iVar14 & 0x1f)) & uVar16 >> ((byte)iVar11 & 0x1f) | uVar17;
              if (uVar18 == 7) {
                if (iVar11 == 0) {
                  uVar16 = (uint)*pbVar13;
                  pbVar13 = pbVar13 + 1;
                  iVar11 = 8;
                }
                if (iVar11 < 0xb) {
                  iVar14 = 0xb;
                  uVar18 = 0;
                  do {
                    iVar14 = iVar14 - iVar11;
                    uVar18 = (~(-1 << ((byte)iVar11 & 0x1f)) & uVar16 | uVar18) <<
                             ((byte)iVar14 & 0x1f);
                    uVar16 = (uint)*pbVar13;
                    pbVar13 = pbVar13 + 1;
                    iVar11 = 8;
                  } while (8 < iVar14);
                }
                else {
                  uVar18 = 0;
                  iVar14 = 0xb;
                }
                pDst[uVar15 + 6] =
                     ~(-1 << ((byte)iVar14 & 0x1f)) & uVar16 >> ((char)iVar11 - (byte)iVar14 & 0x1f)
                     | uVar18;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void tif_11uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst,
                         OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i += 8U) {
        OPJ_UINT32 val0 = *pSrc++;
        OPJ_UINT32 val1 = *pSrc++;
        OPJ_UINT32 val2 = *pSrc++;
        OPJ_UINT32 val3 = *pSrc++;
        OPJ_UINT32 val4 = *pSrc++;
        OPJ_UINT32 val5 = *pSrc++;
        OPJ_UINT32 val6 = *pSrc++;
        OPJ_UINT32 val7 = *pSrc++;
        OPJ_UINT32 val8 = *pSrc++;
        OPJ_UINT32 val9 = *pSrc++;
        OPJ_UINT32 val10 = *pSrc++;

        pDst[i + 0] = (OPJ_INT32)((val0 << 3) | (val1 >> 5));
        pDst[i + 1] = (OPJ_INT32)(((val1 & 0x1FU) << 6) | (val2 >> 2));
        pDst[i + 2] = (OPJ_INT32)(((val2 & 0x3U) << 9) | (val3 << 1) | (val4 >> 7));
        pDst[i + 3] = (OPJ_INT32)(((val4 & 0x7FU) << 4) | (val5 >> 4));
        pDst[i + 4] = (OPJ_INT32)(((val5 & 0xFU) << 7) | (val6 >> 1));
        pDst[i + 5] = (OPJ_INT32)(((val6 & 0x1U) << 10) | (val7 << 2) | (val8 >> 6));
        pDst[i + 6] = (OPJ_INT32)(((val8 & 0x3FU) << 5) | (val9 >> 3));
        pDst[i + 7] = (OPJ_INT32)(((val9 & 0x7U) << 8) | (val10));

    }
    if (length & 7U) {
        unsigned int val;
        int available = 0;

        length = length & 7U;

        GETBITS(pDst[i + 0], 11)

        if (length > 1U) {
            GETBITS(pDst[i + 1], 11)
            if (length > 2U) {
                GETBITS(pDst[i + 2], 11)
                if (length > 3U) {
                    GETBITS(pDst[i + 3], 11)
                    if (length > 4U) {
                        GETBITS(pDst[i + 4], 11)
                        if (length > 5U) {
                            GETBITS(pDst[i + 5], 11)
                            if (length > 6U) {
                                GETBITS(pDst[i + 6], 11)
                            }
                        }
                    }
                }
            }
        }
    }
}